

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::EnhancedLayouts::Utils::ProgramInterface::GetInterfaceForStage_abi_cxx11_
          (string *__return_storage_ptr__,ProgramInterface *this,STAGES stage)

{
  pointer pcVar1;
  uint uVar2;
  ShaderInterface *pSVar3;
  FLAVOUR in_ECX;
  PtrVector *vector;
  PtrVector *vector_00;
  size_t position;
  size_t local_f0;
  long *local_e8 [2];
  long local_d8 [2];
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  local_f0 = 0;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "/* Globals */\nGLOBALS\n\n/* Structures */\nSTRUCTURES\n\n/* Uniforms */\nUNIFORMS\n\n/* Inputs */\nINPUTS\n\n/* Outputs */\nOUTPUTS\n\n/* Storage */\nSTORAGE\n"
             ,"");
  pSVar3 = GetShaderInterface(this,stage);
  GetDefinitions_abi_cxx11_(&local_48,(Utils *)this,vector);
  pcVar1 = (pSVar3->m_globals)._M_dataplus._M_p;
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_e8,pcVar1,pcVar1 + (pSVar3->m_globals)._M_string_length);
  uVar2 = pSVar3->m_stage - TESS_CTRL;
  vector_00 = (PtrVector *)0x0;
  if (uVar2 < 3) {
    in_ECX = 0x19ff24c;
    vector_00 = (PtrVector *)(ulong)*(uint *)(&DAT_019ff24c + (ulong)uVar2 * 4);
  }
  GetDefinitions_abi_cxx11_(&local_68,(Utils *)&pSVar3->m_inputs,vector_00,in_ECX);
  GetDefinitions_abi_cxx11_
            (&local_88,(Utils *)&pSVar3->m_outputs,
             (PtrVector *)(ulong)((uint)(pSVar3->m_stage == TESS_CTRL) * 2),in_ECX);
  GetDefinitions_abi_cxx11_(&local_a8,(Utils *)&pSVar3->m_uniforms,(PtrVector *)0x0,in_ECX);
  GetDefinitions_abi_cxx11_(&local_c8,(Utils *)&pSVar3->m_ssb_blocks,(PtrVector *)0x0,in_ECX);
  replaceToken("GLOBALS",&local_f0,(GLchar *)local_e8[0],__return_storage_ptr__);
  replaceToken("STRUCTURES",&local_f0,local_48._M_dataplus._M_p,__return_storage_ptr__);
  replaceToken("UNIFORMS",&local_f0,local_a8._M_dataplus._M_p,__return_storage_ptr__);
  replaceToken("INPUTS",&local_f0,local_68._M_dataplus._M_p,__return_storage_ptr__);
  replaceToken("OUTPUTS",&local_f0,local_88._M_dataplus._M_p,__return_storage_ptr__);
  replaceToken("STORAGE",&local_f0,local_c8._M_dataplus._M_p,__return_storage_ptr__);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_e8[0] != local_d8) {
    operator_delete(local_e8[0],local_d8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ProgramInterface::GetInterfaceForStage(Shader::STAGES stage) const
{
	size_t		position  = 0;
	std::string interface = "/* Globals */\n"
							"GLOBALS\n"
							"\n"
							"/* Structures */\n"
							"STRUCTURES\n"
							"\n"
							"/* Uniforms */\n"
							"UNIFORMS\n"
							"\n"
							"/* Inputs */\n"
							"INPUTS\n"
							"\n"
							"/* Outputs */\n"
							"OUTPUTS\n"
							"\n"
							"/* Storage */\n"
							"STORAGE\n";

	const ShaderInterface& si = GetShaderInterface(stage);

	const std::string& structures = GetDefinitionsStructures();

	const std::string& globals  = si.GetDefinitionsGlobals();
	const std::string& inputs   = si.GetDefinitionsInputs();
	const std::string& outputs  = si.GetDefinitionsOutputs();
	const std::string& uniforms = si.GetDefinitionsUniforms();
	const std::string& ssbs		= si.GetDefinitionsSSBs();

	replaceToken("GLOBALS", position, globals.c_str(), interface);
	replaceToken("STRUCTURES", position, structures.c_str(), interface);
	replaceToken("UNIFORMS", position, uniforms.c_str(), interface);
	replaceToken("INPUTS", position, inputs.c_str(), interface);
	replaceToken("OUTPUTS", position, outputs.c_str(), interface);
	replaceToken("STORAGE", position, ssbs.c_str(), interface);

	return interface;
}